

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raft_server_req_handlers.cxx
# Opt level: O0

ptr<resp_msg> __thiscall
cornerstone::raft_server::handle_add_srv_req(raft_server *this,req_msg *req)

{
  bool bVar1;
  log_val_type lVar2;
  int32 iVar3;
  int iVar4;
  element_type *this_00;
  size_type sVar5;
  element_type *this_01;
  element_type *peVar6;
  element_type *peVar7;
  element_type *this_02;
  element_type *peVar8;
  socklen_t *__addr_len;
  req_msg *in_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  sockaddr *__addr;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var9;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_02;
  long in_RSI;
  element_type *in_RDI;
  bool bVar10;
  ptr<resp_msg> pVar11;
  executor exec;
  shared_lock<std::shared_timed_mutex> rlock;
  ptr<srv_config> srv_conf;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  *entries;
  ptr<resp_msg> *resp;
  undefined4 in_stack_fffffffffffffd08;
  int in_stack_fffffffffffffd0c;
  strfmt<200> *in_stack_fffffffffffffd10;
  shared_ptr<cornerstone::srv_config> *in_stack_fffffffffffffd18;
  log_entry *in_stack_fffffffffffffd20;
  buffer *in_stack_fffffffffffffd28;
  allocator<char> *in_stack_fffffffffffffd40;
  allocator<char> *__a;
  allocator<char> *in_stack_fffffffffffffd48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffffd50;
  raft_server *in_stack_fffffffffffffdb0;
  socklen_t local_210 [9];
  allocator<char> local_1e9;
  string local_1e8 [39];
  allocator<char> local_1c1;
  strfmt<200> local_1c0;
  string local_f0 [32];
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> local_d0;
  int32 local_c4;
  _Node_iterator_base<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>,_false> local_c0 [5]
  ;
  allocator<char> local_91;
  string local_90 [32];
  uint local_70;
  allocator<char> local_69;
  string local_68 [52];
  undefined4 local_34;
  ulong local_30;
  byte local_21;
  vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
  *local_20;
  
  local_20 = req_msg::log_entries(in_RDX);
  local_21 = 0;
  this_00 = std::
            __shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<cornerstone::srv_state,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                        *)0x1d6bc3);
  local_30 = srv_state::get_term(this_00);
  local_34 = 7;
  cs_new<cornerstone::resp_msg,unsigned_long,cornerstone::msg_type,int&,int&>
            ((unsigned_long *)in_stack_fffffffffffffd28,(msg_type *)in_stack_fffffffffffffd20,
             (int *)in_stack_fffffffffffffd18,(int *)in_stack_fffffffffffffd10);
  sVar5 = std::
          vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
          ::size(local_20);
  if (sVar5 == 1) {
    std::
    vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
    ::operator[](local_20,0);
    this_01 = std::
              __shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
              ::operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                            *)0x1d6c3a);
    lVar2 = log_entry::get_val_type(this_01);
    if (lVar2 == cluster_server) {
      if (*(int *)(in_RSI + 0x128) == 3) {
        std::
        vector<std::shared_ptr<cornerstone::log_entry>,_std::allocator<std::shared_ptr<cornerstone::log_entry>_>_>
        ::operator[](local_20,0);
        std::__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
        operator->((__shared_ptr_access<cornerstone::log_entry,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                    *)0x1d6e6c);
        log_entry::get_buf(in_stack_fffffffffffffd20);
        srv_config::deserialize(in_stack_fffffffffffffd28);
        std::shared_lock<std::shared_timed_mutex>::shared_lock
                  ((shared_lock<std::shared_timed_mutex> *)in_stack_fffffffffffffd10,
                   (mutex_type *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        peVar7 = std::
                 __shared_ptr_access<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d6ed1);
        local_c4 = srv_config::get_id(peVar7);
        local_c0[0]._M_cur =
             (__node_type *)
             std::
             unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
             ::find((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                     *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08),
                    (key_type *)0x1d6f02);
        local_d0._M_cur =
             (__node_type *)
             std::
             unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
             ::end((unordered_map<int,_std::shared_ptr<cornerstone::peer>,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_std::shared_ptr<cornerstone::peer>_>_>_>
                    *)CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
        bVar1 = std::__detail::operator!=(local_c0,&local_d0);
        bVar10 = true;
        if (!bVar1) {
          iVar4 = *(int *)(in_RSI + 0xc);
          peVar7 = std::
                   __shared_ptr_access<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1d6f70);
          iVar3 = srv_config::get_id(peVar7);
          bVar10 = iVar4 == iVar3;
        }
        if (bVar10) {
          peVar6 = std::
                   __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1d6fb0);
          strfmt<200>::strfmt(&local_1c0,
                              "the server to be added has a duplicated id with existing server %d");
          peVar7 = std::
                   __shared_ptr_access<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                   ::operator->((__shared_ptr_access<cornerstone::srv_config,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                 *)0x1d6fd8);
          srv_config::get_id(peVar7);
          in_stack_fffffffffffffd50 =
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               strfmt<200>::fmt<int>(in_stack_fffffffffffffd10,in_stack_fffffffffffffd0c);
          in_stack_fffffffffffffd48 = &local_1c1;
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
                     in_stack_fffffffffffffd40);
          (*peVar6->_vptr_logger[4])(peVar6,local_f0);
          std::__cxx11::string::~string(local_f0);
          std::allocator<char>::~allocator(&local_1c1);
          local_21 = 1;
        }
        local_70 = (uint)bVar10;
        std::shared_lock<std::shared_timed_mutex>::~shared_lock
                  ((shared_lock<std::shared_timed_mutex> *)in_stack_fffffffffffffd10);
        if (local_70 == 0) {
          if ((*(byte *)(in_RSI + 0x29) & 1) == 0) {
            std::shared_ptr<cornerstone::srv_config>::operator=
                      ((shared_ptr<cornerstone::srv_config> *)in_stack_fffffffffffffd10,
                       (shared_ptr<cornerstone::srv_config> *)
                       CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
            std::function<void(cornerstone::peer&)>::
            function<cornerstone::raft_server::handle_add_srv_req(cornerstone::req_msg&)::__0,void>
                      ((function<void_(cornerstone::peer_&)> *)in_stack_fffffffffffffd20,
                       (anon_class_8_1_8991fb9c *)in_stack_fffffffffffffd18);
            std::unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>::
            operator*((unique_ptr<cornerstone::context,_std::default_delete<cornerstone::context>_>
                       *)in_stack_fffffffffffffd10);
            __addr_len = local_210;
            cs_new<cornerstone::peer,std::shared_ptr<cornerstone::srv_config>&,cornerstone::context&,std::function<void(cornerstone::peer&)>&>
                      (in_stack_fffffffffffffd18,(context *)in_stack_fffffffffffffd10,
                       (function<void_(cornerstone::peer_&)> *)
                       CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
            std::shared_ptr<cornerstone::peer>::operator=
                      ((shared_ptr<cornerstone::peer> *)in_stack_fffffffffffffd10,
                       (shared_ptr<cornerstone::peer> *)
                       CONCAT44(in_stack_fffffffffffffd0c,in_stack_fffffffffffffd08));
            std::shared_ptr<cornerstone::peer>::~shared_ptr
                      ((shared_ptr<cornerstone::peer> *)0x1d72be);
            invite_srv_to_join_cluster(in_stack_fffffffffffffdb0);
            this_02 = std::
                      __shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                      ::operator->((__shared_ptr_access<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                    *)0x1d72da);
            peVar8 = std::
                     __shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<cornerstone::log_store,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1d72f3);
            iVar4 = (*peVar8->_vptr_log_store[2])();
            resp_msg::accept(this_02,iVar4,__addr,__addr_len);
            local_21 = 1;
            local_70 = 1;
            std::function<void_(cornerstone::peer_&)>::~function
                      ((function<void_(cornerstone::peer_&)> *)0x1d7337);
          }
          else {
            peVar6 = std::
                     __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                     ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                                   *)0x1d713d);
            __a = &local_1e9;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,__a);
            (*peVar6->_vptr_logger[3])(peVar6,local_1e8);
            std::__cxx11::string::~string(local_1e8);
            std::allocator<char>::~allocator(&local_1e9);
            local_21 = 1;
            local_70 = 1;
          }
        }
        std::shared_ptr<cornerstone::srv_config>::~shared_ptr
                  ((shared_ptr<cornerstone::srv_config> *)0x1d7369);
        _Var9._M_pi = extraout_RDX_01;
      }
      else {
        peVar6 = std::
                 __shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                 ::operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                               *)0x1d6d82);
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,
                   in_stack_fffffffffffffd40);
        (*peVar6->_vptr_logger[3])(peVar6,local_90);
        std::__cxx11::string::~string(local_90);
        std::allocator<char>::~allocator(&local_91);
        local_21 = 1;
        local_70 = 1;
        _Var9._M_pi = extraout_RDX_00;
      }
      goto LAB_001d737a;
    }
  }
  peVar6 = std::__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<cornerstone::logger,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                       *)0x1d6c6f);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_stack_fffffffffffffd50,(char *)in_stack_fffffffffffffd48,in_stack_fffffffffffffd40);
  (*peVar6->_vptr_logger[2])(peVar6,local_68);
  std::__cxx11::string::~string(local_68);
  std::allocator<char>::~allocator(&local_69);
  local_21 = 1;
  local_70 = 1;
  _Var9._M_pi = extraout_RDX;
LAB_001d737a:
  if ((local_21 & 1) == 0) {
    std::shared_ptr<cornerstone::resp_msg>::~shared_ptr
              ((shared_ptr<cornerstone::resp_msg> *)0x1d7391);
    _Var9._M_pi = extraout_RDX_02;
  }
  pVar11.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var9._M_pi;
  pVar11.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>._M_ptr = in_RDI;
  return (ptr<resp_msg>)pVar11.super___shared_ptr<cornerstone::resp_msg,_(__gnu_cxx::_Lock_policy)2>
  ;
}

Assistant:

ptr<resp_msg> raft_server::handle_add_srv_req(req_msg& req)
{
    std::vector<ptr<log_entry>>& entries(req.log_entries());
    ptr<resp_msg> resp(cs_new<resp_msg>(state_->get_term(), msg_type::add_server_response, id_, leader_));
    if (entries.size() != 1 || entries[0]->get_val_type() != log_val_type::cluster_server)
    {
        l_->debug("bad add server request as we are expecting one log entry with value type of ClusterServer");
        return resp;
    }

    if (role_ != srv_role::leader)
    {
        l_->info("this is not a leader, cannot handle AddServerRequest");
        return resp;
    }

    ptr<srv_config> srv_conf(srv_config::deserialize(entries[0]->get_buf()));
    {
        read_lock(peers_lock_);
        if (peers_.find(srv_conf->get_id()) != peers_.end() || id_ == srv_conf->get_id())
        {
            l_->warn(
                lstrfmt("the server to be added has a duplicated id with existing server %d").fmt(srv_conf->get_id()));
            return resp;
        }
    }

    if (config_changing_)
    {
        // the previous config has not committed yet
        l_->info("previous config has not committed yet");
        return resp;
    }

    conf_to_add_ = std::move(srv_conf);
    timer_task<peer&>::executor exec = [this](peer& p) { this->handle_hb_timeout(p); };
    srv_to_join_ = cs_new<peer>(conf_to_add_, *ctx_, exec);
    invite_srv_to_join_cluster();
    resp->accept(log_store_->next_slot());
    return resp;
}